

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O1

void ggml_vec_dot_f16(int n,float *s,size_t bs,ggml_fp16_t *x,size_t bx,ggml_fp16_t *y,size_t by,
                     int nrc)

{
  undefined1 auVar1 [16];
  float fVar2;
  uint uVar3;
  ggml_fp16_t *pgVar4;
  ulong uVar5;
  ggml_fp16_t *pgVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 local_180 [64];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  uVar3 = n & 0xffffffc0;
  local_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  local_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  local_180 = ZEXT1664(ZEXT816(0));
  if (0 < (int)uVar3) {
    uVar5 = 0;
    pgVar4 = y;
    pgVar6 = x;
    do {
      lVar7 = 0;
      do {
        auVar9 = vcvtph2ps_avx512f(*(undefined1 (*) [32])((long)pgVar6 + lVar7));
        auVar10 = vcvtph2ps_avx512f(*(undefined1 (*) [32])((long)pgVar4 + lVar7));
        auVar9 = vfmadd213ps_avx512f(auVar10,auVar9,*(undefined1 (*) [64])(local_180 + lVar7 * 2));
        *(undefined1 (*) [64])(local_180 + lVar7 * 2) = auVar9;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x80);
      uVar5 = uVar5 + 0x40;
      pgVar4 = pgVar4 + 0x40;
      pgVar6 = pgVar6 + 0x40;
    } while (uVar5 < uVar3);
  }
  lVar7 = 0;
  do {
    auVar9 = vaddps_avx512f(*(undefined1 (*) [64])(local_180 + lVar7),
                            *(undefined1 (*) [64])((long)&local_100 + lVar7));
    *(undefined1 (*) [64])(local_180 + lVar7) = auVar9;
    lVar7 = lVar7 + 0x40;
  } while (lVar7 == 0x40);
  auVar9._8_8_ = uStack_138;
  auVar9._0_8_ = local_140;
  auVar9._16_8_ = uStack_130;
  auVar9._24_8_ = uStack_128;
  auVar9._32_8_ = uStack_120;
  auVar9._40_8_ = uStack_118;
  auVar9._48_8_ = uStack_110;
  auVar9._56_8_ = uStack_108;
  auVar9 = vaddps_avx512f(local_180,auVar9);
  auVar8 = vextractf64x4_avx512f(auVar9,1);
  auVar9 = vaddps_avx512f(auVar9,ZEXT3264(auVar8));
  auVar11._0_4_ = auVar9._0_4_ + auVar9._16_4_;
  auVar11._4_4_ = auVar9._4_4_ + auVar9._20_4_;
  auVar11._8_4_ = auVar9._8_4_ + auVar9._24_4_;
  auVar11._12_4_ = auVar9._12_4_ + auVar9._28_4_;
  auVar1 = vshufpd_avx(auVar11,auVar11,1);
  auVar12._0_4_ = auVar11._0_4_ + auVar1._0_4_;
  auVar12._4_4_ = auVar11._4_4_ + auVar1._4_4_;
  auVar12._8_4_ = auVar11._8_4_ + auVar1._8_4_;
  auVar12._12_4_ = auVar11._12_4_ + auVar1._12_4_;
  auVar1 = vhaddps_avx(auVar12,auVar12);
  fVar2 = auVar1._0_4_;
  if (uVar3 != n) {
    lVar7 = (long)(int)uVar3;
    do {
      fVar2 = fVar2 + *(float *)(&ggml_table_f32_f16 + (ulong)x[lVar7] * 4) *
                      *(float *)(&ggml_table_f32_f16 + (ulong)y[lVar7] * 4);
      lVar7 = lVar7 + 1;
    } while (lVar7 < n);
  }
  *s = fVar2;
  return;
}

Assistant:

void ggml_vec_dot_f16(int n, float * GGML_RESTRICT s, size_t bs, ggml_fp16_t * GGML_RESTRICT x, size_t bx, ggml_fp16_t * GGML_RESTRICT y, size_t by, int nrc) {
    assert(nrc == 1);
    GGML_UNUSED(nrc);
    GGML_UNUSED(bx);
    GGML_UNUSED(by);
    GGML_UNUSED(bs);

    ggml_float sumf = 0.0;

#if defined(GGML_SIMD)
    const int np = (n & ~(GGML_F16_STEP - 1));

    GGML_F16_VEC sum[GGML_F16_ARR] = { GGML_F16_VEC_ZERO };

    GGML_F16_VEC ax[GGML_F16_ARR];
    GGML_F16_VEC ay[GGML_F16_ARR];

    for (int i = 0; i < np; i += GGML_F16_STEP) {
        for (int j = 0; j < GGML_F16_ARR; j++) {
            ax[j] = GGML_F16_VEC_LOAD(x + i + j*GGML_F16_EPR, j);
            ay[j] = GGML_F16_VEC_LOAD(y + i + j*GGML_F16_EPR, j);

            sum[j] = GGML_F16_VEC_FMA(sum[j], ax[j], ay[j]);
        }
    }

    // reduce sum0..sum3 to sum0
    GGML_F16_VEC_REDUCE(sumf, sum);

    // leftovers
    for (int i = np; i < n; ++i) {
        sumf += (ggml_float)(GGML_FP16_TO_FP32(x[i])*GGML_FP16_TO_FP32(y[i]));
    }
#else
    for (int i = 0; i < n; ++i) {
        sumf += (ggml_float)(GGML_FP16_TO_FP32(x[i])*GGML_FP16_TO_FP32(y[i]));
    }
#endif

    *s = sumf;
}